

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall iu_Matcher_x_iutest_x_Property_Test::Body(iu_Matcher_x_iutest_x_Property_Test *this)

{
  bool bVar1;
  code *pcVar2;
  _Rb_tree_node_base *p_Var3;
  AssertionResult *pAVar4;
  X *in_RDX;
  map<int,_(anonymous_namespace)::X,_std::less<int>,_std::allocator<std::pair<const_int,_(anonymous_namespace)::X>_>_>
  *v;
  X **v_00;
  X *v_01;
  iutest *this_00;
  AssertionResult *in_R8;
  AssertionResult iutest_ar;
  AssertionResult iutest_ar_2;
  undefined1 local_2c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2b0;
  bool local_2a0;
  undefined4 local_294;
  AssertionResult local_290;
  AssertionResult local_268;
  AssertionResult local_240;
  int local_218 [2];
  AssertionResult local_210;
  string local_1e8;
  undefined1 local_1c8 [8];
  undefined8 *local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8;
  undefined **local_1a8;
  code **local_1a0;
  GeMatcher<int> local_198 [21];
  code *local_40;
  undefined8 local_38;
  
  local_1c0 = (undefined8 *)local_2c0;
  local_2c0._0_8_ = anon_unknown.dwarf_5b49a::X::GetA;
  local_2c0._8_8_ = (int *)0x0;
  local_1c8 = (undefined1  [8])&PTR__IMatcher_00223880;
  local_1b8._M_allocated_capacity._0_4_ = 1;
  iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,int>::operator()
            (&local_290,(PropertyMatcher<int((anonymous_namespace)::X::*)()const,int> *)local_1c8,
             in_RDX);
  if (local_290.m_result == false) {
    v_01 = (X *)0x0;
    memset((iu_global_format_stringstream *)local_1c8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c8);
    iutest::PrintToString<(anonymous_namespace)::X>(&local_240.m_message,v_01);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_268.m_message,(detail *)local_240.m_message._M_dataplus._M_p,
               "Property(&X::GetA, 1)",(char *)&local_290,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              ((iuCodeMessage *)local_2c0,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x170,local_268.m_message._M_dataplus._M_p);
    local_294 = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)local_2c0,(Fixed *)local_1c8);
    std::__cxx11::string::~string((string *)local_2c0);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_240);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1c8);
  }
  std::__cxx11::string::~string((string *)&local_290);
  local_268.m_message._M_string_length = (size_type)&local_240;
  local_240.m_message._M_dataplus._M_p = (pointer)anon_unknown.dwarf_5b49a::X::GetA;
  local_240.m_message._M_string_length = 0;
  local_2c0._8_8_ = &local_268.m_message.field_2;
  local_268.m_message._M_dataplus._M_p = (pointer)&PTR__IMatcher_00223880;
  local_268.m_message.field_2._M_allocated_capacity._0_4_ = 1;
  local_2c0._0_8_ = &PTR__IMatcher_00224340;
  local_210.m_message._M_dataplus._M_p._0_4_ = (anonymous_namespace)::gx;
  iutest::detail::EqMatcher<int>::operator()
            ((AssertionResult *)local_1c8,(EqMatcher<int> *)local_2c0,(int *)&local_210);
  bVar1 = local_1a8._0_1_;
  std::__cxx11::string::~string((string *)local_1c8);
  if (bVar1 == true) {
    local_290.m_message._M_string_length = 0;
    local_290.m_message.field_2._M_local_buf[0] = '\0';
    local_290.m_result = true;
    local_290.m_message._M_dataplus._M_p = (pointer)&local_290.m_message.field_2;
  }
  else {
    local_1c8 = (undefined1  [8])&local_1b8;
    local_1c0 = (undefined8 *)0x0;
    local_1b8._M_allocated_capacity = local_1b8._M_allocated_capacity & 0xffffffffffffff00;
    local_1a8 = (undefined **)((ulong)local_1a8 & 0xffffffffffffff00);
    iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,int>::WhichIs_abi_cxx11_
              ((string *)local_2c0,
               (PropertyMatcher<int((anonymous_namespace)::X::*)()const,int> *)&local_268);
    pAVar4 = iutest::AssertionResult::operator<<
                       ((AssertionResult *)local_1c8,
                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_2c0);
    iutest::AssertionResult::AssertionResult(&local_290,pAVar4);
    std::__cxx11::string::~string((string *)local_2c0);
    std::__cxx11::string::~string((string *)local_1c8);
    if ((local_290.m_result & 1U) == 0) {
      memset((iu_global_format_stringstream *)local_1c8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1c8);
      local_210.m_message._M_dataplus._M_p = (pointer)&(anonymous_namespace)::gx;
      iutest::PrintToString<(anonymous_namespace)::X*>
                (&local_240.m_message,(iutest *)&local_210,v_00);
      iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
                (&local_268.m_message,(detail *)local_240.m_message._M_dataplus._M_p,
                 "Property(&X::GetA, 1)",(char *)&local_290,in_R8);
      iutest::detail::iuCodeMessage::iuCodeMessage
                ((iuCodeMessage *)local_2c0,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
                 ,0x171,local_268.m_message._M_dataplus._M_p);
      local_294 = 1;
      iutest::AssertionHelper::operator=((AssertionHelper *)local_2c0,(Fixed *)local_1c8);
      std::__cxx11::string::~string((string *)local_2c0);
      std::__cxx11::string::~string((string *)&local_268);
      std::__cxx11::string::~string((string *)&local_240);
      iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1c8);
    }
  }
  std::__cxx11::string::~string((string *)&local_290);
  local_1a0 = &local_40;
  local_40 = anon_unknown.dwarf_5b49a::X::GetA;
  local_38 = 0;
  local_198[0].m_expected = local_218;
  local_218[0] = 0;
  local_1b8._8_8_ = local_218 + 1;
  local_218[1] = 10;
  local_1c8 = (undefined1  [8])&PTR__EachMatcher_00223940;
  local_1c0 = &PTR__PairMatcher_00223900;
  local_1b8._M_allocated_capacity = (size_type)&PTR__IMatcher_00224780;
  local_1a8 = &PTR__PropertyMatcher_002238c0;
  local_198[0].super_IMatcher._vptr_IMatcher = (_func_int **)&PTR__IMatcher_00224880;
  p_Var3 = (_Rb_tree_node_base *)(anonymous_namespace)::mx._24_8_;
  do {
    if (p_Var3 == (_Rb_tree_node_base *)((anonymous_namespace)::mx + 8)) {
      local_210.m_message._M_dataplus._M_p = (pointer)&local_210.m_message.field_2;
      local_210.m_message._M_string_length = 0;
      local_210.m_message.field_2._M_local_buf[0] = '\0';
      local_210.m_result = true;
LAB_0019823a:
      std::__cxx11::string::~string((string *)&local_210);
      return;
    }
    iutest::detail::LeMatcher<int>::operator()
              ((AssertionResult *)local_2c0,(LeMatcher<int> *)&local_1b8,(int *)(p_Var3 + 1));
    bVar1 = local_2a0;
    std::__cxx11::string::~string((string *)local_2c0);
    if (bVar1 == false) {
      local_2c0._0_8_ = local_2c0 + 0x10;
      local_2c0._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_2b0._M_local_buf[0] = '\0';
      local_2a0 = false;
      iutest::detail::
      PairMatcher<iutest::detail::LeMatcher<int>,iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,iutest::detail::GeMatcher<int>>>
      ::WhichIs_abi_cxx11_(&local_290.m_message,&local_1c0);
      pAVar4 = iutest::AssertionResult::operator<<
                         ((AssertionResult *)local_2c0,&local_290.m_message);
      iutest::AssertionResult::AssertionResult(&local_240,pAVar4);
      std::__cxx11::string::~string((string *)&local_290);
LAB_00198035:
      std::__cxx11::string::~string((string *)local_2c0);
    }
    else {
      pcVar2 = *local_1a0;
      if (((ulong)pcVar2 & 1) != 0) {
        pcVar2 = *(code **)(pcVar2 + *(long *)(&p_Var3[1].field_0x4 + (long)local_1a0[1]) + -1);
      }
      local_1e8._M_dataplus._M_p._0_4_ = (*pcVar2)();
      iutest::detail::GeMatcher<int>::operator()
                ((AssertionResult *)local_2c0,local_198,(int *)&local_1e8);
      bVar1 = local_2a0;
      std::__cxx11::string::~string((string *)local_2c0);
      if (bVar1 == true) {
        local_290.m_message._M_dataplus._M_p = (pointer)&local_290.m_message.field_2;
        local_290.m_message._M_string_length = 0;
        local_290.m_message.field_2._M_local_buf[0] = '\0';
        local_290.m_result = true;
        std::__cxx11::string::~string((string *)&local_290);
      }
      else {
        local_2c0._0_8_ = local_2c0 + 0x10;
        local_2c0._8_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x0;
        local_2b0._M_local_buf[0] = '\0';
        local_2a0 = false;
        iutest::detail::
        PropertyMatcher<int((anonymous_namespace)::X::*)()const,iutest::detail::GeMatcher<int>>::
        WhichIs_abi_cxx11_(&local_1e8,&local_1a8);
        pAVar4 = iutest::AssertionResult::operator<<((AssertionResult *)local_2c0,&local_1e8);
        iutest::AssertionResult::AssertionResult(&local_290,pAVar4);
        std::__cxx11::string::~string((string *)&local_1e8);
        std::__cxx11::string::~string((string *)local_2c0);
        bVar1 = local_290.m_result;
        std::__cxx11::string::~string((string *)&local_290);
        if ((bVar1 & 1U) == 0) {
          local_2c0._0_8_ = local_2c0 + 0x10;
          local_2c0._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x0;
          local_2b0._M_local_buf[0] = '\0';
          local_2a0 = false;
          iutest::detail::
          PairMatcher<iutest::detail::LeMatcher<int>,iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,iutest::detail::GeMatcher<int>>>
          ::WhichIs_abi_cxx11_(&local_290.m_message,&local_1c0);
          pAVar4 = iutest::AssertionResult::operator<<
                             ((AssertionResult *)local_2c0,&local_290.m_message);
          iutest::AssertionResult::AssertionResult(&local_240,pAVar4);
          std::__cxx11::string::~string((string *)&local_290);
          goto LAB_00198035;
        }
      }
      local_240.m_message._M_dataplus._M_p = (pointer)&local_240.m_message.field_2;
      local_240.m_message._M_string_length = 0;
      local_240.m_message.field_2._M_local_buf[0] = '\0';
      local_240.m_result = true;
    }
    iutest::AssertionResult::operator!(&local_268,&local_240);
    bVar1 = local_268.m_result;
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_240);
    if (bVar1 != false) {
      local_2c0._0_8_ = local_2c0 + 0x10;
      local_2c0._8_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)0x0;
      local_2b0._M_local_buf[0] = '\0';
      local_2a0 = false;
      iutest::detail::
      EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,iutest::detail::PropertyMatcher<int((anonymous_namespace)::X::*)()const,iutest::detail::GeMatcher<int>>>>
      ::WhichIs_abi_cxx11_(&local_290.m_message,local_1c8);
      pAVar4 = iutest::AssertionResult::operator<<
                         ((AssertionResult *)local_2c0,&local_290.m_message);
      iutest::AssertionResult::AssertionResult(&local_210,pAVar4);
      std::__cxx11::string::~string((string *)&local_290);
      std::__cxx11::string::~string((string *)local_2c0);
      if ((local_210.m_result & 1U) == 0) {
        this_00 = (iutest *)0x0;
        memset((iu_global_format_stringstream *)local_1c8,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1c8);
        iutest::
        PrintToString<std::map<int,(anonymous_namespace)::X,std::less<int>,std::allocator<std::pair<int_const,(anonymous_namespace)::X>>>>
                  (&local_268.m_message,this_00,v);
        iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
                  (&local_290.m_message,(detail *)local_268.m_message._M_dataplus._M_p,
                   "Each(Pair(Le(10), Property(&X::GetA, Ge(0))))",(char *)&local_210,in_R8);
        iutest::detail::iuCodeMessage::iuCodeMessage
                  ((iuCodeMessage *)local_2c0,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
                   ,0x173,local_290.m_message._M_dataplus._M_p);
        local_294 = 1;
        iutest::AssertionHelper::operator=((AssertionHelper *)local_2c0,(Fixed *)local_1c8);
        std::__cxx11::string::~string((string *)local_2c0);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&local_268);
        iutest::iu_global_format_stringstream::~iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1c8);
      }
      goto LAB_0019823a;
    }
    p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
  } while( true );
}

Assistant:

IUTEST(Matcher, Property)
{
    IUTEST_EXPECT_THAT( gx, Property(&X::GetA, 1));
    IUTEST_EXPECT_THAT(&gx, Property(&X::GetA, 1));
#if IUTEST_HAS_MATCHER_EACH
    IUTEST_EXPECT_THAT( mx, Each(Pair(Le(10), Property(&X::GetA, Ge(0)))));
#endif
}